

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch_and_reduce_algorithm.cpp
# Opt level: O0

void __thiscall
branch_and_reduce_algorithm::get_articulation_points_iteratively(branch_and_reduce_algorithm *this)

{
  size_type sVar1;
  reference pvVar2;
  int local_58;
  value_type_conflict1 local_54;
  int i;
  value_type_conflict1 local_4c;
  initializer_list<int> local_48;
  initializer_list<int> local_38;
  initializer_list<int> local_28;
  int local_14;
  branch_and_reduce_algorithm *pbStack_10;
  int n;
  branch_and_reduce_algorithm *this_local;
  
  this->current_dfs_num = 0;
  pbStack_10 = this;
  sVar1 = std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::size(&this->adj);
  local_14 = (int)sVar1;
  std::initializer_list<int>::initializer_list(&local_28);
  std::vector<int,_std::allocator<int>_>::operator=(&this->visited,local_28);
  std::initializer_list<int>::initializer_list(&local_38);
  std::vector<int,_std::allocator<int>_>::operator=(&this->minNr,local_38);
  std::initializer_list<int>::initializer_list(&local_48);
  std::vector<int,_std::allocator<int>_>::operator=(&this->articulation_points,local_48);
  local_4c = -1;
  std::vector<int,_std::allocator<int>_>::resize(&this->visited,(long)local_14,&local_4c);
  i = -1;
  std::vector<int,_std::allocator<int>_>::resize(&this->minNr,(long)local_14,&i);
  local_54 = 0;
  std::vector<int,_std::allocator<int>_>::resize
            (&this->articulation_points,(long)local_14,&local_54);
  for (local_58 = 0; local_58 < local_14; local_58 = local_58 + 1) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&this->x,(long)local_58);
    if (*pvVar2 < 0) {
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&this->visited,(long)local_58);
      if (*pvVar2 < 0) {
        dfs_iteratively(this,local_58);
      }
    }
  }
  return;
}

Assistant:

void branch_and_reduce_algorithm::get_articulation_points_iteratively()
{
    current_dfs_num = 0;
    const int n = adj.size();

    visited = {};
    minNr = {};
    articulation_points = {};

    visited.resize(n, -1);
    minNr.resize(n, -1);
    articulation_points.resize(n, 0);

    for (int i = 0; i < n; i++)
        if (x[i] < 0 && visited[i] < 0) // node active but not yet visited
            dfs_iteratively(i);
}